

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEsop.c
# Opt level: O0

void Eso_ManMinimizeAdd(Eso_Man_t *p,int Cube)

{
  int iVar1;
  int iVar2;
  Vec_Int_t *pVVar3;
  Vec_Int_t *pVVar4;
  int *piVar5;
  int local_74;
  int *local_70;
  Vec_Int_t *local_68;
  Vec_Int_t *vLevel_2;
  Vec_Int_t *vLevel_1;
  int iPlace;
  int iLit;
  int k;
  int c;
  Vec_Int_t *vLevel;
  int nLits;
  int Cube2;
  int *pCube;
  int *pCube2;
  Vec_Int_t *vCube;
  int fMimimize;
  int Cube_local;
  Eso_Man_t *p_local;
  
  if (Cube == p->Cube1) {
    local_68 = (Vec_Int_t *)0x0;
  }
  else {
    local_68 = Eso_ManCube(p,Cube);
  }
  if (Cube == p->Cube1) {
    local_70 = (int *)0x0;
  }
  else {
    local_70 = Vec_IntArray(local_68);
  }
  if (Cube == p->Cube1) {
    local_74 = 0;
  }
  else {
    local_74 = Vec_IntSize(local_68);
  }
  pVVar3 = Vec_WecEntry(p->vCubes,local_74);
  iVar1 = Vec_IntFind(pVVar3,Cube);
  if (iVar1 < 0) {
    if (Cube == p->Cube1) {
      iVar1 = Vec_IntSize(pVVar3);
      if (iVar1 != 0) {
        __assert_fail("Vec_IntSize(vLevel) == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaEsop.c"
                      ,0x10b,"void Eso_ManMinimizeAdd(Eso_Man_t *, int)");
      }
      Vec_IntPush(pVVar3,Cube);
    }
    else {
      if (local_74 < p->nVars + -1) {
        pVVar4 = Vec_WecEntry(p->vCubes,local_74 + 1);
        for (iLit = 0; iVar1 = Vec_IntSize(pVVar4), iLit < iVar1; iLit = iLit + 1) {
          iVar1 = Vec_IntEntry(pVVar4,iLit);
          piVar5 = Hsh_VecReadArray(p->pHash,iVar1);
          iVar1 = Eso_ManFindDistOneLitNotEqual(local_70,piVar5,local_74);
          if (iVar1 != -1) {
            Vec_IntDrop(pVVar4,iLit);
            Vec_IntClear(p->vCube);
            for (iPlace = 0; iPlace <= local_74; iPlace = iPlace + 1) {
              pVVar3 = p->vCube;
              iVar2 = Abc_LitNotCond(piVar5[iPlace],(uint)(iPlace == iVar1));
              Vec_IntPush(pVVar3,iVar2);
            }
            iVar1 = Hsh_VecManAdd(p->pHash,p->vCube);
            Eso_ManMinimizeAdd(p,iVar1);
            return;
          }
        }
      }
      for (iLit = 0; iVar1 = Vec_IntSize(pVVar3), iLit < iVar1; iLit = iLit + 1) {
        iVar1 = Vec_IntEntry(pVVar3,iLit);
        piVar5 = Hsh_VecReadArray(p->pHash,iVar1);
        iVar1 = Eso_ManFindDistOneLitEqual(piVar5,local_70,local_74);
        if (iVar1 != -1) {
          Vec_IntDrop(pVVar3,iLit);
          Vec_IntClear(p->vCube);
          for (iPlace = 0; iPlace < local_74; iPlace = iPlace + 1) {
            if (iPlace != iVar1) {
              Vec_IntPush(p->vCube,local_70[iPlace]);
            }
          }
          iVar1 = Vec_IntSize(p->vCube);
          if (iVar1 == 0) {
            vCube._4_4_ = p->Cube1;
          }
          else {
            vCube._4_4_ = Hsh_VecManAdd(p->pHash,p->vCube);
          }
          Eso_ManMinimizeAdd(p,vCube._4_4_);
          return;
        }
      }
      if (local_74 < 1) {
        __assert_fail("nLits > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaEsop.c"
                      ,0x13e,"void Eso_ManMinimizeAdd(Eso_Man_t *, int)");
      }
      vCube._4_4_ = Cube;
      if (0 < local_74) {
        pVVar4 = Vec_WecEntry(p->vCubes,local_74 + -1);
        if ((local_74 == 1) && (iVar1 = Vec_IntSize(pVVar4), iVar1 == 1)) {
          Vec_IntDrop(pVVar4,0);
          vCube._4_4_ = Abc_LitNot(Cube);
        }
        else {
          for (iLit = 0; iVar1 = Vec_IntSize(pVVar4), iLit < iVar1; iLit = iLit + 1) {
            iVar1 = Vec_IntEntry(pVVar4,iLit);
            piVar5 = Hsh_VecReadArray(p->pHash,iVar1);
            iVar1 = Eso_ManFindDistOneLitNotEqual(piVar5,local_70,local_74 + -1);
            if (iVar1 != -1) {
              Vec_IntDrop(pVVar4,iLit);
              Vec_IntClear(p->vCube);
              for (iPlace = 0; iPlace < local_74; iPlace = iPlace + 1) {
                pVVar3 = p->vCube;
                iVar2 = Abc_LitNotCond(local_70[iPlace],(uint)(iPlace == iVar1));
                Vec_IntPush(pVVar3,iVar2);
              }
              iVar1 = Hsh_VecManAdd(p->pHash,p->vCube);
              Eso_ManMinimizeAdd(p,iVar1);
              return;
            }
          }
        }
      }
      Vec_IntPush(pVVar3,vCube._4_4_);
    }
  }
  else {
    Vec_IntDrop(pVVar3,iVar1);
  }
  return;
}

Assistant:

void Eso_ManMinimizeAdd( Eso_Man_t * p, int Cube )
{
    int fMimimize = 1;
    Vec_Int_t * vCube      = (Cube == p->Cube1) ? NULL : Eso_ManCube(p, Cube); 
    int * pCube2, * pCube  = (Cube == p->Cube1) ? NULL : Vec_IntArray(vCube); 
    int Cube2, nLits       = (Cube == p->Cube1) ? 0 : Vec_IntSize(vCube);
    Vec_Int_t * vLevel     = Vec_WecEntry( p->vCubes, nLits );
    int c, k, iLit, iPlace = Vec_IntFind( vLevel, Cube );
    if ( iPlace >= 0 ) // identical found
    {
        Vec_IntDrop( vLevel, iPlace );
        return;
    }
    if ( Cube == p->Cube1 ) // simple case
    {
        assert( Vec_IntSize(vLevel) == 0 );
        Vec_IntPush( vLevel, Cube );
        return;
    }
    // look for distance-1 in next bin
    if ( fMimimize && nLits < p->nVars - 1 )
    {
        Vec_Int_t * vLevel = Vec_WecEntry( p->vCubes, nLits+1 );
        Vec_IntForEachEntry( vLevel, Cube2, c )
        {
            pCube2 = Hsh_VecReadArray( p->pHash, Cube2 ); 
            iLit = Eso_ManFindDistOneLitNotEqual( pCube, pCube2, nLits );
            if ( iLit == -1 )
                continue;
            // remove this cube
            Vec_IntDrop( vLevel, c );
            // create new cube
            Vec_IntClear( p->vCube );
            for ( k = 0; k <= nLits; k++ )
                Vec_IntPush( p->vCube, Abc_LitNotCond(pCube2[k], k == iLit) );
            Cube = Hsh_VecManAdd( p->pHash, p->vCube );
            // try to add new cube
            Eso_ManMinimizeAdd( p, Cube );
            return;
        }
    }
    // look for distance-1 in the same bin
    if ( fMimimize )
    {
        Vec_IntForEachEntry( vLevel, Cube2, c )
        {
            pCube2 = Hsh_VecReadArray( p->pHash, Cube2 ); 
            iLit = Eso_ManFindDistOneLitEqual( pCube2, pCube, nLits );
            if ( iLit == -1 )
                continue;
            // remove this cube
            Vec_IntDrop( vLevel, c );
            // create new cube
            Vec_IntClear( p->vCube );
            for ( k = 0; k < nLits; k++ )
                if ( k != iLit )
                    Vec_IntPush( p->vCube, pCube[k] );
            if ( Vec_IntSize(p->vCube) == 0 )
                Cube = p->Cube1;
            else
                Cube = Hsh_VecManAdd( p->pHash, p->vCube );
            // try to add new cube
            Eso_ManMinimizeAdd( p, Cube );
            return;
        }
    }
    assert( nLits > 0 );
    if ( fMimimize && nLits > 0 )
    {
        // look for distance-1 in the previous bin
        Vec_Int_t * vLevel = Vec_WecEntry( p->vCubes, nLits-1 );
        // check for the case of one-literal cube
        if ( nLits == 1 && Vec_IntSize(vLevel) == 1 )
        {
            Vec_IntDrop( vLevel, 0 );
            Cube = Abc_LitNot( Cube );
        }
        else
        Vec_IntForEachEntry( vLevel, Cube2, c )
        {
            pCube2 = Hsh_VecReadArray( p->pHash, Cube2 ); 
            iLit = Eso_ManFindDistOneLitNotEqual( pCube2, pCube, nLits-1 );
            if ( iLit == -1 )
                continue;
            // remove this cube
            Vec_IntDrop( vLevel, c );
            // create new cube
            Vec_IntClear( p->vCube );
            for ( k = 0; k < nLits; k++ )
                Vec_IntPush( p->vCube, Abc_LitNotCond(pCube[k], k == iLit) );
            Cube = Hsh_VecManAdd( p->pHash, p->vCube );
            // try to add new cube
            Eso_ManMinimizeAdd( p, Cube );
            return;
        }
    }
    // could not find - simply add this cube
    Vec_IntPush( vLevel, Cube );
}